

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  Table *this_01;
  undefined8 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  FILE *__stream;
  char *pcVar4;
  SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>
  *set;
  Capital CVar5;
  size_t num_bytes;
  size_type __dnew_1;
  char contents [24];
  string kExpectedDense;
  string kExpectedSparse;
  TypeParam ht_out;
  AssertHelper local_198;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_190;
  undefined8 *local_188;
  AssertHelper local_180;
  undefined1 local_178 [32];
  undefined1 local_158 [16];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [16];
  AssertHelper local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  local_f0;
  
  local_110._M_dataplus._M_p = (pointer)0x0;
  local_110._M_string_length = local_110._M_string_length & 0xffffffff00000000;
  local_178._0_8_ = (pointer)0x0;
  local_178._8_8_ = local_178._8_8_ & 0xffffffff00000000;
  local_130._M_dataplus._M_p = local_130._M_dataplus._M_p & 0xffffffff00000000;
  local_130._M_string_length = 0;
  this_00 = &local_f0.ht_;
  local_f0._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c18478;
  set = (SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>
         *)&local_190;
  google::
  sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(this_00,0,(Hasher *)&local_110,(Hasher *)local_178,(Capital *)local_158,set,
                     (Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
                      *)&local_130);
  local_f0._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c183f8;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_110._M_dataplus._M_p = &DAT_00000018;
  local_130._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_130,(ulong)&local_110);
  local_130.field_2._M_allocated_capacity = (size_type)local_110._M_dataplus._M_p;
  *(undefined8 *)local_130._M_dataplus._M_p = 0x42865713;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 8) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 9) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 10) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 0xb) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 0xc) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 0xd) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 0xe) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 0xf) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 0x10) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 0x11) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 0x12) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 0x13) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 0x14) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 0x15) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 0x16) = '\0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p + 0x17) = '\0';
  local_130._M_string_length = (size_type)local_110._M_dataplus._M_p;
  local_130._M_dataplus._M_p[(long)local_110._M_dataplus._M_p] = '\0';
  local_178._0_8_ = (char *)0x14;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)local_178);
  local_110.field_2._M_allocated_capacity = local_178._0_8_;
  builtin_strncpy(local_110._M_dataplus._M_p,"$hu1",5);
  local_110._M_dataplus._M_p[5] = '\0';
  local_110._M_dataplus._M_p[6] = '\0';
  local_110._M_dataplus._M_p[7] = ' ';
  local_110._M_dataplus._M_p[8] = '\0';
  local_110._M_dataplus._M_p[9] = '\0';
  local_110._M_dataplus._M_p[10] = '\0';
  local_110._M_dataplus._M_p[0xb] = '\0';
  local_110._M_dataplus._M_p[0xc] = '\0';
  local_110._M_dataplus._M_p[0xd] = '\0';
  local_110._M_dataplus._M_p[0xe] = '\0';
  local_110._M_dataplus._M_p[0xf] = '\0';
  local_110._M_dataplus._M_p[0x10] = '\0';
  local_110._M_dataplus._M_p[0x11] = '\0';
  local_110._M_dataplus._M_p[0x12] = '\0';
  local_110._M_dataplus._M_p[0x13] = '\0';
  local_110._M_string_length = local_178._0_8_;
  local_110._M_dataplus._M_p[local_178._0_8_] = '\0';
  __stream = tmpfile();
  CVar5 = (Capital)(__stream != (FILE *)0x0);
  local_158._8_8_ = (undefined8 *)0x0;
  local_158[0] = CVar5;
  if (!(bool)CVar5) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_178,(internal *)local_158,(AssertionResult *)"fp != __null","false",
               "true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x542,(char *)local_178._0_8_);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_);
    }
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
    uVar2 = local_158._8_8_;
    if ((undefined8 *)local_158._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_158._8_8_ != (undefined8 *)(local_158._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_158._8_8_);
      }
      operator_delete((void *)uVar2);
    }
  }
  google::
  sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_00);
  this_01 = &local_f0.ht_.table;
  local_158[0] = (Capital)google::
                          sparsetable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                          ::write_metadata<_IO_FILE>(this_01,(_IO_FILE *)__stream);
  local_158._8_8_ = (undefined8 *)0x0;
  if (!(bool)local_158[0]) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_178,(internal *)local_158,
               (AssertionResult *)"ht_out.write_metadata(fp)","false","true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x544,(char *)local_178._0_8_);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_);
    }
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
    uVar2 = local_158._8_8_;
    if ((undefined8 *)local_158._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_158._8_8_ != (undefined8 *)(local_158._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_158._8_8_);
      }
      operator_delete((void *)uVar2);
    }
  }
  local_158[0] = (Capital)google::
                          sparsetable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                          ::write_nopointer_data(this_01,(FILE *)__stream);
  local_158._8_8_ = (undefined8 *)0x0;
  if (!(bool)local_158[0]) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_178,(internal *)local_158,
               (AssertionResult *)"ht_out.write_nopointer_data(fp)","false","true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x545,(char *)local_178._0_8_);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_);
    }
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
    uVar2 = local_158._8_8_;
    if ((undefined8 *)local_158._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_158._8_8_ != (undefined8 *)(local_158._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_158._8_8_);
      }
      operator_delete((void *)uVar2);
    }
  }
  local_180.data_ = (AssertHelperData *)ftell(__stream);
  rewind(__stream);
  local_158._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x18;
  testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
            ((internal *)local_178,"num_bytes","static_cast<size_t>(24)",(unsigned_long *)&local_180
             ,(unsigned_long *)local_158);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if ((char *)local_178._8_8_ == (char *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_178._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x549,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_158._0_8_ + 8))();
    }
  }
  uVar2 = local_178._8_8_;
  if ((char *)local_178._8_8_ != (char *)0x0) {
    if (*(char **)local_178._8_8_ != (char *)(local_178._8_8_ + 0x10)) {
      operator_delete(*(char **)local_178._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_190._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       fread(local_158,1,(size_t)local_180.data_,__stream);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_178,"num_bytes","fread(contents, 1, num_bytes, fp)",
             (unsigned_long *)&local_180,(unsigned_long *)&local_190);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if ((char *)local_178._8_8_ == (char *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_178._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x54b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  uVar2 = local_178._8_8_;
  if ((char *)local_178._8_8_ != (char *)0x0) {
    if (*(char **)local_178._8_8_ != (char *)(local_178._8_8_ + 0x10)) {
      operator_delete(*(char **)local_178._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_190._M_head_impl._0_4_ = 0xffffffff;
  local_198.data_._0_4_ = fgetc(__stream);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_178,"(-1)","fgetc(fp)",(int *)&local_190,(int *)&local_198);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if ((char *)local_178._8_8_ == (char *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_178._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x54c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  uVar2 = local_178._8_8_;
  if ((char *)local_178._8_8_ != (char *)0x0) {
    if (*(char **)local_178._8_8_ != (char *)(local_178._8_8_ + 0x10)) {
      operator_delete(*(char **)local_178._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  fclose(__stream);
  if (local_158[0] == (Capital)*local_130._M_dataplus._M_p) {
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,local_158,
               (undefined1 *)((long)&(local_180.data_)->type + (long)local_158));
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&local_190,"kExpectedDense","string(contents, num_bytes)",&local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_);
    }
    if (local_190._M_head_impl._0_1_ ==
        (SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>
         )0x0) {
      testing::Message::Message((Message *)local_178);
      if (local_188 == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (char *)*local_188;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x550,pcVar4);
      testing::internal::AssertHelper::operator=(&local_198,(Message *)local_178);
LAB_009c8d95:
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      if ((long *)local_178._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_178._0_8_ + 8))();
      }
    }
  }
  else {
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,local_158,
               (undefined1 *)((long)&(local_180.data_)->type + (long)local_158));
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&local_190,"kExpectedSparse","string(contents, num_bytes)",&local_110,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_);
    }
    if (local_190._M_head_impl._0_1_ ==
        (SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>
         )0x0) {
      testing::Message::Message((Message *)local_178);
      if (local_188 == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (char *)*local_188;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x552,pcVar4);
      testing::internal::AssertHelper::operator=(&local_198,(Message *)local_178);
      goto LAB_009c8d95;
    }
  }
  if (local_188 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_188 != local_188 + 2) {
      operator_delete((undefined8 *)*local_188);
    }
    operator_delete(local_188);
  }
  local_178._8_8_ = (char *)0x0;
  local_178[0x10] = '\0';
  local_180.data_ = (AssertHelperData *)local_178;
  local_178._0_8_ = local_178 + 0x10;
  google::
  sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_00);
  bVar3 = google::
          sparsetable<std::__cxx11::string,(unsigned_short)48,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
          ::serialize<google::sparsehash_internal::pod_serializer<std::__cxx11::string>,StringIO>
                    ((sparsetable<std::__cxx11::string,(unsigned_short)48,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
                      *)this_01,&local_180);
  local_190._M_head_impl._0_1_ =
       (SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>
        )bVar3;
  local_188 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)&local_190,
               (AssertionResult *)
               "ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio)","false",
               "true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x55b,(char *)local_158._0_8_);
    testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158._0_8_
        != local_148) {
      operator_delete((void *)local_158._0_8_);
    }
    if ((long *)CONCAT44(local_198.data_._4_4_,(int)local_198.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_198.data_._4_4_,(int)local_198.data_) + 8))();
    }
    puVar1 = local_188;
    if (local_188 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_188 != local_188 + 2) {
        operator_delete((undefined8 *)*local_188);
      }
      operator_delete(puVar1);
    }
  }
  if (*(char *)local_178._0_8_ == *local_130._M_dataplus._M_p) {
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)local_158,"kExpectedDense","stringbuf",&local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
    if (local_158[0] != (Capital)0x0) goto LAB_009c8fe0;
    testing::Message::Message((Message *)&local_190);
    if ((undefined8 *)local_158._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_158._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x55d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_190);
  }
  else {
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)local_158,"kExpectedSparse","stringbuf",&local_110,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
    if (local_158[0] != (Capital)0x0) goto LAB_009c8fe0;
    testing::Message::Message((Message *)&local_190);
    if ((undefined8 *)local_158._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_158._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x55f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_190);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_198);
  if (local_190._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_190._M_head_impl + 8))();
  }
LAB_009c8fe0:
  uVar2 = local_158._8_8_;
  if ((undefined8 *)local_158._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_158._8_8_ != (undefined8 *)(local_158._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_158._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::~BaseHashtableInterface(&local_f0);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, MetadataSerializationAndEndianness) {
  TypeParam ht_out;
  string kExpectedDense(
      "\x13W\x86"
      "B\0\0\0\0\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0",
      24);
  string kExpectedSparse("$hu1\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0", 20);

  if (ht_out.supports_readwrite()) {
    auto fp = tmpfile();
    EXPECT_TRUE(fp != NULL);

    EXPECT_TRUE(ht_out.write_metadata(fp));
    EXPECT_TRUE(ht_out.write_nopointer_data(fp));

    const size_t num_bytes = ftell(fp);
    rewind(fp);
    EXPECT_LE(num_bytes, static_cast<size_t>(24));
    char contents[24];
    EXPECT_EQ(num_bytes, fread(contents, 1, num_bytes, fp));
    EXPECT_EQ(EOF, fgetc(fp));  // check we're *exactly* the right size
    fclose(fp);
    // TODO(csilvers): check type of ht_out instead of looking at the 1st byte.
    if (contents[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, string(contents, num_bytes));
    } else {
      EXPECT_EQ(kExpectedSparse, string(contents, num_bytes));
    }
  }

  // Do it again with new-style serialization.  Here we can use StringIO.
  if (ht_out.supports_serialization()) {
    string stringbuf;
    StringIO stringio(&stringbuf);
    EXPECT_TRUE(
        ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));
    if (stringbuf[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, stringbuf);
    } else {
      EXPECT_EQ(kExpectedSparse, stringbuf);
    }
  }
}